

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

xmlParserInputBufferPtr xmlNewInputBufferString(char *str,xmlParserInputFlags flags)

{
  xmlParserInputBufferPtr pxVar1;
  size_t size;
  xmlBufPtr pxVar2;
  
  pxVar1 = (xmlParserInputBufferPtr)(*xmlMalloc)(0x40);
  if (pxVar1 != (xmlParserInputBufferPtr)0x0) {
    pxVar1->compressed = 0;
    pxVar1->error = 0;
    pxVar1->rawconsumed = 0;
    pxVar1->buffer = (xmlBufPtr)0x0;
    pxVar1->raw = (xmlBufPtr)0x0;
    pxVar1->closecallback = (xmlInputCloseCallback)0x0;
    pxVar1->encoder = (xmlCharEncodingHandlerPtr)0x0;
    pxVar1->context = (void *)0x0;
    pxVar1->readcallback = (xmlInputReadCallback)0x0;
    pxVar1->compressed = -1;
    size = strlen(str);
    pxVar2 = xmlBufCreateMem((xmlChar *)str,size,flags >> 1 & 1);
    pxVar1->buffer = pxVar2;
    if (pxVar2 != (xmlBufPtr)0x0) {
      return pxVar1;
    }
    (*xmlFree)(pxVar1);
  }
  return (xmlParserInputBufferPtr)0x0;
}

Assistant:

xmlParserInputBufferPtr
xmlNewInputBufferString(const char *str, xmlParserInputFlags flags) {
    xmlParserInputBufferPtr ret;

    ret = xmlMalloc(sizeof(*ret));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlParserInputBuffer));
    ret->compressed = -1;

    ret->buffer = xmlBufCreateMem((const xmlChar *) str, strlen(str),
                                  (flags & XML_INPUT_BUF_STATIC ? 1 : 0));
    if (ret->buffer == NULL) {
        xmlFree(ret);
	return(NULL);
    }

    return(ret);
}